

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void dbuf_set(level *lev,int x,int y,rm *loc_override,int bg,int trap,int obj,int obj_mn,
             int obj_stacks,int obj_prize,int invis,int mon,int monflags,int effect)

{
  boolean bVar1;
  xchar x_00;
  xchar y_00;
  int iVar2;
  nh_dbuf_entry *pnVar3;
  char *pcVar4;
  ushort local_70;
  char local_6c;
  char local_68;
  ushort local_64;
  ushort local_60;
  byte local_5c;
  ushort local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  rm *local_48;
  aligntyp a;
  rm *loc;
  nh_dbuf_entry *dbe;
  int trap_local;
  int bg_local;
  rm *loc_override_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  if ((((0 < x) && (x < 0x50)) && (-1 < y)) && (y < 0x15)) {
    pnVar3 = dbuf[y] + x;
    local_48 = loc_override;
    if (loc_override == (rm *)0x0) {
      local_48 = lev->locations[x] + y;
    }
    local_4c = bg;
    if (bg == -1) {
      local_4c = *(uint *)local_48 & 0x3f;
    }
    pnVar3->bg = (short)local_4c;
    local_50 = trap;
    if (trap == -1) {
      local_50 = *(uint *)local_48 >> 6 & 0x1f;
    }
    pnVar3->trap = (short)local_50;
    if (obj == -1) {
      local_54 = *(uint *)local_48 >> 0xb & 0x3ff;
    }
    else {
      local_54 = obj;
    }
    iVar2 = obfuscate_object(local_54);
    pnVar3->obj = (short)iVar2;
    if (obj_mn == -1) {
      local_58 = (ushort)(*(uint *)local_48 >> 0x15) & 0x1ff;
    }
    else {
      local_58 = (ushort)obj_mn;
    }
    pnVar3->obj_mn = local_58;
    pnVar3->objflags = 0;
    if ((obj_stacks == 0) || ((obj_stacks == -1 && ((*(uint *)local_48 >> 0x1e & 1) == 0)))) {
      pnVar3->objflags = pnVar3->objflags & 0xfffe;
    }
    else {
      pnVar3->objflags = pnVar3->objflags | 1;
    }
    if ((obj_prize == 0) || ((obj_prize == -1 && (-1 < (int)*(uint *)local_48)))) {
      pnVar3->objflags = pnVar3->objflags & 0xfffd;
    }
    else {
      pnVar3->objflags = pnVar3->objflags | 2;
    }
    if (invis == -1) {
      local_5c = (byte)(*(uint *)&local_48->field_0x6 >> 3) & 1;
    }
    else {
      local_5c = (byte)invis;
    }
    pnVar3->invis = local_5c;
    pnVar3->mon = (short)mon;
    pnVar3->monflags = (short)monflags;
    pnVar3->effect = effect;
    pnVar3->dgnflags = 0;
    if ((lev == level) && ((viz_array[y][x] & 2U) != 0)) {
      pnVar3->dgnflags = pnVar3->dgnflags | 1;
    }
    if ((pnVar3->bg == 0x1c) || (pnVar3->bg == 0x1b)) {
      if (local_48->typ == '\x17') {
        if ((*(uint *)&local_48->field_0x6 & 1) == 0) {
          local_60 = 0;
        }
        else {
          local_60 = 2;
          if ((*(uint *)&local_48->field_0x6 >> 4 & 8) != 0) {
            local_60 = 4;
          }
        }
        pnVar3->dgnflags = pnVar3->dgnflags | local_60;
        if ((*(uint *)&local_48->field_0x6 >> 1 & 1) == 0) {
          local_64 = 0;
        }
        else {
          local_64 = 8;
          if ((*(uint *)&local_48->field_0x6 >> 4 & 0x10) != 0) {
            local_64 = 0x10;
          }
        }
        pnVar3->dgnflags = pnVar3->dgnflags | local_64;
      }
      else {
        pnVar3->dgnflags = pnVar3->dgnflags;
        pnVar3->dgnflags = pnVar3->dgnflags;
      }
    }
    if (local_48->typ == '!') {
      if ((*(uint *)&local_48->field_0x6 >> 4 & 7) == 0) {
        local_68 = -0x80;
      }
      else {
        if ((*(uint *)&local_48->field_0x6 >> 4 & 7) == 4) {
          local_6c = '\x01';
        }
        else {
          local_6c = ((byte)(*(uint *)&local_48->field_0x6 >> 4) & 7) - 2;
        }
        local_68 = local_6c;
      }
      bVar1 = on_level(&lev->z,&dungeon_topology.d_astral_level);
      if ((bVar1 == '\0') && (local_68 != -0x80)) {
        if (local_68 == '\x01') {
          local_70 = 0x20;
        }
        else {
          local_70 = 0x60;
          if (local_68 == '\0') {
            local_70 = 0x40;
          }
        }
      }
      else {
        local_70 = 0;
      }
      pnVar3->dgnflags = pnVar3->dgnflags | local_70;
    }
    x_00 = (xchar)x;
    y_00 = (xchar)y;
    pcVar4 = in_rooms(lev,x_00,y_00,5);
    if (*pcVar4 == '\0') {
      pcVar4 = in_rooms(lev,x_00,y_00,0xe);
      if (*pcVar4 == '\0') {
        bVar1 = on_level(&lev->z,&dungeon_topology.d_minetown_level);
        if ((bVar1 == '\0') || (pcVar4 = in_rooms(lev,x_00,y_00,0), *pcVar4 == '\0')) {
          bVar1 = In_W_tower(lev,x,y);
          if (bVar1 != '\0') {
            pnVar3->dgnflags = pnVar3->dgnflags | 0x200;
          }
        }
        else {
          pnVar3->dgnflags = pnVar3->dgnflags | 0x180;
        }
      }
      else {
        pnVar3->dgnflags = pnVar3->dgnflags | 0x100;
      }
    }
    else {
      pnVar3->dgnflags = pnVar3->dgnflags | 0x80;
    }
  }
  return;
}

Assistant:

void dbuf_set(const struct level *lev, int x, int y,
	      const struct rm *loc_override,
	      int bg, int trap,
	      int obj, int obj_mn, int obj_stacks, int obj_prize,
	      int invis, int mon, int monflags,
	      int effect)
{
    struct nh_dbuf_entry *dbe;
    const struct rm *loc;

    if (!isok(x, y))
	return;

    dbe = &dbuf[y][x];
    loc = loc_override ? loc_override : &lev->locations[x][y];

    dbe->bg = (bg != -1) ? bg : loc->mem_bg;
    dbe->trap = (trap != -1) ? trap : loc->mem_trap;
    dbe->obj = obfuscate_object((obj != -1) ? obj : loc->mem_obj);
    dbe->obj_mn = (obj_mn != -1) ? obj_mn : loc->mem_obj_mn;

    dbe->objflags = DOBJ_NORMAL;
    if (obj_stacks == 0 || (obj_stacks == -1 && loc->mem_obj_stacks == 0))
	dbe->objflags &= ~DOBJ_STACKS;
    else
	dbe->objflags |= DOBJ_STACKS;
    if (obj_prize == 0 || (obj_prize == -1 && loc->mem_obj_prize == 0))
	dbe->objflags &= ~DOBJ_PRIZE;
    else
	dbe->objflags |= DOBJ_PRIZE;

    dbe->invis = (invis != -1) ? invis : loc->mem_invis;

    dbe->mon = mon;
    dbe->monflags = monflags;
    dbe->effect = effect;

    dbe->dgnflags = 0;

    if (lev == level && cansee(x, y))
	dbe->dgnflags |= NH_DF_VISIBLE_MASK;

    if (dbe->bg == S_hcdoor || dbe->bg == S_vcdoor) {
	if (!IS_DOOR(loc->typ)) {
	    dbe->dgnflags |= NH_DF_DOORLOCK_UNKNOWN;
	    dbe->dgnflags |= NH_DF_DOORTRAP_UNKNOWN;
	} else {
	    dbe->dgnflags |=
		    loc->mem_door_l == 0 ? NH_DF_DOORLOCK_UNKNOWN :
		    (loc->doormask & D_LOCKED) ? NH_DF_DOORLOCK_LOCKED :
		    NH_DF_DOORLOCK_UNLOCKED;
	    dbe->dgnflags |=
		    loc->mem_door_t == 0 ? NH_DF_DOORTRAP_UNKNOWN :
		    (loc->doormask & D_TRAPPED) ? NH_DF_DOORTRAP_TRAPPED :
		    NH_DF_DOORTRAP_UNTRAPPED;
	}
    }

    if (IS_ALTAR(loc->typ)) {
	aligntyp a = Amask2align(loc->altarmask & AM_MASK);
	dbe->dgnflags |=
		(Is_astralevel(&lev->z) || a == A_NONE) ? NH_DF_ALTARALIGN_OTHER :
		(a == A_LAWFUL) ? NH_DF_ALTARALIGN_LAWFUL :
		(a == A_NEUTRAL) ? NH_DF_ALTARALIGN_NEUTRAL :
		NH_DF_ALTARALIGN_CHAOTIC;
    }

    if (*in_rooms(lev, x, y, BEEHIVE))
	dbe->dgnflags |= NH_DF_BGHINT_BEEHIVE;
    else if (*in_rooms(lev, x, y, GARDEN))
	dbe->dgnflags |= NH_DF_BGHINT_GARDEN;
    else if (Is_minetown_level(&lev->z) && *in_rooms(lev, x, y, 0))
	dbe->dgnflags |= NH_DF_BGHINT_MINEROOM;
    else if (In_W_tower(lev, x, y))
	dbe->dgnflags |= NH_DF_BGHINT_WIZTOWER;
}